

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  long *plVar1;
  int iVar2;
  undefined8 *__dest;
  undefined8 *in_RCX;
  Fts5Buffer *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  bool bVar3;
  i64 iMin;
  int i;
  i64 iPrev;
  Fts5PoslistReader *aNew;
  sqlite3_int64 nByte;
  Fts5IndexIter *pIter;
  Fts5ExprTerm *p;
  int rc;
  int nAlloc;
  int nIter;
  Fts5PoslistReader *aIter;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Fts5PoslistWriter *pWriter;
  undefined4 in_stack_ffffffffffffff00;
  int iVar4;
  Fts5PoslistWriter *local_f8;
  long local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  undefined1 local_90 [8];
  undefined8 local_88 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_88,0xaa,0x80);
  local_c0 = local_88;
  local_c4 = 0;
  local_c8 = 4;
  local_cc = 0;
  local_d8 = in_RDI;
  do {
    if (local_d8 == 0) {
      if (local_c4 == 1) {
        *in_RCX = *local_c0;
        *in_R8 = *(int *)(local_c0 + 1);
      }
      else {
        memset(local_90,0,8);
        local_f8 = (Fts5PoslistWriter *)0xffffffffffffffff;
        sqlite3Fts5BufferZero(in_RDX);
        while( true ) {
          pWriter = (Fts5PoslistWriter *)0x7fffffffffffffff;
          for (iVar4 = 0; iVar4 < local_c4; iVar4 = iVar4 + 1) {
            if (((*(char *)((long)local_c0 + (long)iVar4 * 0x20 + 0x11) == '\0') &&
                (((Fts5PoslistWriter *)local_c0[(long)iVar4 * 4 + 3] != local_f8 ||
                 (iVar2 = sqlite3Fts5PoslistReaderNext((Fts5PoslistReader *)0x274084), iVar2 == 0)))
                ) && ((long)local_c0[(long)iVar4 * 4 + 3] < (long)pWriter)) {
              pWriter = (Fts5PoslistWriter *)local_c0[(long)iVar4 * 4 + 3];
            }
          }
          if ((pWriter == (Fts5PoslistWriter *)0x7fffffffffffffff) || (local_cc != 0)) break;
          local_cc = sqlite3Fts5PoslistWriterAppend
                               ((Fts5Buffer *)CONCAT44(iVar4,in_stack_ffffffffffffff00),pWriter,
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          local_f8 = pWriter;
        }
        if (local_cc == 0) {
          *in_RCX = in_RDX->p;
          *in_R8 = in_RDX->n;
        }
      }
LAB_00274145:
      if (local_c0 != local_88) {
        sqlite3_free((void *)0x274161);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_cc;
    }
    plVar1 = *(long **)(local_d8 + 0x18);
    if (((*(char *)((long)plVar1 + 0x14) == '\0') && (*plVar1 == in_RSI)) && ((int)plVar1[2] != 0))
    {
      if (local_c4 == local_c8) {
        __dest = (undefined8 *)
                 sqlite3_malloc64(CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (__dest == (undefined8 *)0x0) {
          local_cc = 7;
          goto LAB_00274145;
        }
        memcpy(__dest,local_c0,(long)local_c4 << 5);
        local_c8 = local_c8 << 1;
        bVar3 = local_c0 != local_88;
        local_c0 = __dest;
        if (bVar3) {
          sqlite3_free((void *)0x273f68);
        }
      }
      sqlite3Fts5PoslistReaderInit
                ((u8 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec,(Fts5PoslistReader *)0x273f99);
      local_c4 = local_c4 + 1;
    }
    local_d8 = *(long *)(local_d8 + 0x20);
  } while( true );
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm,
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}